

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O0

CImgDisplay * __thiscall
cimg_library::CImgDisplay::assign<float>
          (CImgDisplay *this,CImg<float> *img,char *title,uint normalization_type,
          bool fullscreen_flag,bool closed_flag)

{
  float *pfVar1;
  CImg<float> *pCVar2;
  CImgDisplay *this_00;
  CImg<float> local_78;
  CImg<float> *local_58;
  CImg<float> *nimg;
  CImg<float> tmp;
  bool closed_flag_local;
  bool fullscreen_flag_local;
  uint normalization_type_local;
  char *title_local;
  CImg<float> *img_local;
  CImgDisplay *this_local;
  
  tmp._data._2_1_ = closed_flag;
  tmp._data._3_1_ = fullscreen_flag;
  tmp._data._4_4_ = normalization_type;
  pfVar1 = cimg_library::CImg::operator_cast_to_float_((CImg *)img);
  if (pfVar1 == (float *)0x0) {
    this_local = assign(this);
  }
  else {
    CImg<float>::CImg((CImg<float> *)&nimg);
    local_58 = img;
    if (img->_depth != 1) {
      CImg<float>::get_projections2d
                (&local_78,img,img->_width - 1 >> 1,img->_height - 1 >> 1,img->_depth - 1 >> 1);
      pCVar2 = CImg<float>::operator=((CImg<float> *)&nimg,&local_78);
      CImg<float>::~CImg(&local_78);
      local_58 = pCVar2;
    }
    _assign(this,local_58->_width,local_58->_height,title,tmp._data._4_4_,
            (bool)(tmp._data._3_1_ & 1),(bool)(tmp._data._2_1_ & 1));
    if (this->_normalization == 2) {
      pfVar1 = CImg<float>::min_max<float>(local_58,&this->_max);
      this->_min = *pfVar1;
    }
    this_00 = render<float>(this,local_58,false);
    this_local = paint(this_00,true);
    CImg<float>::~CImg((CImg<float> *)&nimg);
  }
  return this_local;
}

Assistant:

CImgDisplay& assign(const CImg<T>& img, const char *const title=0,
                        const unsigned int normalization_type=3,
                        const bool fullscreen_flag=false, const bool closed_flag=false) {
      if (!img) return assign();
      CImg<T> tmp;
      const CImg<T>& nimg = (img._depth==1)?img:(tmp=img.get_projections2d((img._width-1)/2,(img._height-1)/2,(img._depth-1)/2));
      _assign(nimg._width,nimg._height,title,normalization_type,fullscreen_flag,closed_flag);
      if (_normalization==2) _min = (float)nimg.min_max(_max);
      return render(nimg).paint();
    }